

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall zstr::Exception::Exception(Exception *this,z_stream *zstrm_p,int ret)

{
  int in_ECX;
  undefined4 in_register_00000014;
  string local_30;
  
  error_to_message_abi_cxx11_
            (&local_30,(Exception *)zstrm_p,(z_stream *)CONCAT44(in_register_00000014,ret),in_ECX);
  std::ios_base::failure[abi:cxx11]::failure((string *)this);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__failure_00432648;
  return;
}

Assistant:

Exception(z_stream* zstrm_p, int ret)
      : std::ios_base::failure(error_to_message(zstrm_p, ret)) {}